

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri.c
# Opt level: O0

void draw(void)

{
  (*glad_glClear)(0x4100);
  (*glad_glVertexPointer)(2,0x1406,0,draw::verts);
  (*glad_glColorPointer)(4,0x1406,0,draw::colors);
  (*glad_glEnableClientState)(0x8074);
  (*glad_glEnableClientState)(0x8076);
  (*glad_glDrawArrays)(4,0,3);
  (*glad_glPointSizex)(0xf7ff0);
  (*glad_glDrawArrays)(0,0,3);
  (*glad_glDisableClientState)(0x8074);
  (*glad_glDisableClientState)(0x8076);
  glfwSwapBuffers(window);
  return;
}

Assistant:

static void
draw(void)
{
#if USE_FIXED_POINT
   static const GLfixed verts[3][2] = {
      { -65536, -65536 },
      {  65536, -65536 },
      {      0,  65536 }
   };
   static const GLfixed colors[3][4] = {
      { 65536,     0,     0,    65536 },
      {     0, 65536,     0 ,   65536},
      {     0,     0, 65536 ,   65536}
   };
#else
   static const GLfloat verts[3][2] = {
      { -1, -1 },
      {  1, -1 },
      {  0,  1 }
   };
   static const GLfloat colors[3][4] = {
      { 1, 0, 0, 1 },
      { 0, 1, 0, 1 },
      { 0, 0, 1, 1 }
   };
#endif

   glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

   {
#if USE_FIXED_POINT
      glVertexPointer(2, GL_FIXED, 0, verts);
      glColorPointer(4, GL_FIXED, 0, colors);
#else
      glVertexPointer(2, GL_FLOAT, 0, verts);
      glColorPointer(4, GL_FLOAT, 0, colors);
#endif
      glEnableClientState(GL_VERTEX_ARRAY);
      glEnableClientState(GL_COLOR_ARRAY);

      /* draw triangle */
      glDrawArrays(GL_TRIANGLES, 0, 3);

      /* draw some points */
      glPointSizex(FLOAT_TO_FIXED(15.5));
      glDrawArrays(GL_POINTS, 0, 3);

      glDisableClientState(GL_VERTEX_ARRAY);
      glDisableClientState(GL_COLOR_ARRAY);
   }

   glfwSwapBuffers(window);
}